

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::FloatingPointLE<double>(char *expr1,char *expr2,double val1,double val2)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *this;
  AssertionResult *other;
  AssertionResult *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  stringstream *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  AssertionResult AVar4;
  stringstream val2_ss;
  stringstream val1_ss;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  FloatingPoint<double> *in_stack_fffffffffffffbd0;
  FloatingPoint<double> *in_stack_fffffffffffffbd8;
  char (*in_stack_fffffffffffffbf8) [12];
  AssertionResult *in_stack_fffffffffffffc00;
  stringstream *ss;
  string local_3b8 [32];
  string local_398 [52];
  int local_364;
  stringstream local_360 [16];
  ostream local_350 [396];
  int local_1c4;
  stringstream local_1c0 [16];
  ostream local_1b0 [376];
  FloatingPoint<double> local_38;
  FloatingPoint<double> local_30;
  double local_28;
  double local_20 [4];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  
  if (in_XMM1_Qa <= in_XMM0_Qa) {
    ss = in_RDI;
    local_28 = in_XMM1_Qa;
    local_20[0] = in_XMM0_Qa;
    FloatingPoint<double>::FloatingPoint(&local_30,local_20);
    FloatingPoint<double>::FloatingPoint(&local_38,&local_28);
    bVar1 = FloatingPoint<double>::AlmostEquals(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0)
    ;
    if (bVar1) {
      AVar4 = AssertionSuccess();
      _Var3._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar4.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1c0);
      local_1c4 = (int)std::setprecision(0x11);
      poVar2 = std::operator<<(local_1b0,(_Setprecision)local_1c4);
      std::ostream::operator<<(poVar2,local_20[0]);
      std::__cxx11::stringstream::stringstream(local_360);
      local_364 = (int)std::setprecision(0x11);
      poVar2 = std::operator<<(local_350,(_Setprecision)local_364);
      std::ostream::operator<<(poVar2,local_28);
      AssertionFailure();
      this = AssertionResult::operator<<(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      other = AssertionResult::operator<<
                        (in_stack_fffffffffffffc00,(char **)in_stack_fffffffffffffbf8);
      this_00 = AssertionResult::operator<<
                          (in_stack_fffffffffffffc00,(char (*) [7])in_stack_fffffffffffffbf8);
      value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              AssertionResult::operator<<(this_00,(char **)in_stack_fffffffffffffbf8);
      AssertionResult::operator<<(this_00,(char (*) [3])value);
      AssertionResult::operator<<(this_00,(char (*) [11])value);
      StringStreamToString(ss);
      AssertionResult::operator<<(this_00,value);
      AssertionResult::operator<<(this_00,(char (*) [5])value);
      StringStreamToString(ss);
      AssertionResult::operator<<(this_00,value);
      AssertionResult::AssertionResult(this,other);
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::string::~string(local_398);
      AssertionResult::~AssertionResult((AssertionResult *)0x140c5f);
      std::__cxx11::stringstream::~stringstream(local_360);
      std::__cxx11::stringstream::~stringstream(local_1c0);
      _Var3._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
  }
  else {
    AVar4 = AssertionSuccess();
    _Var3._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar4.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  AVar4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var3._M_head_impl;
  AVar4._0_8_ = in_RDI;
  return AVar4;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}